

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

win32 * __thiscall
pstore::path::win32::join
          (win32 *this,string *path,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *paths)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator pbVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [36];
  undefined4 local_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  string local_128 [8];
  string p_path;
  string local_108 [8];
  string p_drive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  string local_68 [8];
  string result_path;
  string local_48 [8];
  string result_drive;
  anon_class_1_0_00000001 local_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *piStack_20;
  anon_class_1_0_00000001 is_path_sep;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paths_local;
  string *path_local;
  
  piStack_20 = paths;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  split_drive(&local_a8,path);
  std::tie<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&__range2,&local_a8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_a8);
  this_00 = piStack_20;
  __end2 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(piStack_20);
  pbVar4 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(this_00);
  for (; __end2 != pbVar4; __end2 = __end2 + 0x20) {
    std::__cxx11::string::string(local_108);
    std::__cxx11::string::string(local_128);
    split_drive(&local_168,__end2);
    std::tie<std::__cxx11::string,std::__cxx11::string>
              (local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)local_178,&local_168);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_168);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_128);
      bVar1 = join::anon_class_1_0_00000001::operator()(&local_21,*pcVar6);
      if (!bVar1) goto LAB_00167b6b;
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) || (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
        std::__cxx11::string::operator=(local_48,local_108);
      }
      std::__cxx11::string::operator=(local_68,local_128);
      local_17c = 3;
    }
    else {
LAB_00167b6b:
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_108,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48), bVar1)) {
        lVar7 = std::__cxx11::string::length();
        if ((lVar7 != 2) ||
           (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_108), *pcVar6 != ':')) {
          assert_failed("p_drive.length () == 2 && p_drive[1] == \':\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/path.cpp"
                        ,0x8c);
        }
        lVar7 = std::__cxx11::string::length();
        if ((lVar7 != 0) &&
           ((lVar7 = std::__cxx11::string::length(), lVar7 != 2 ||
            (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar6 != ':'))))
        {
          assert_failed("result_drive.length () == 0 || (result_drive.length () == 2 && result_drive[1] == \':\')"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/path.cpp"
                        ,0x8e);
        }
        lVar7 = std::__cxx11::string::length();
        if (lVar7 != 0) {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_108);
          iVar2 = tolower((int)*pcVar6);
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          iVar3 = tolower((int)*pcVar6);
          if (iVar2 == iVar3) {
            std::__cxx11::string::operator=(local_48,local_108);
            goto LAB_00167d01;
          }
        }
        std::__cxx11::string::operator=(local_48,local_108);
        std::__cxx11::string::operator=(local_68,local_128);
        local_17c = 3;
      }
      else {
LAB_00167d01:
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          pcVar6 = (char *)std::__cxx11::string::back();
          bVar1 = join::anon_class_1_0_00000001::operator()(&local_21,*pcVar6);
          if (!bVar1) {
            std::__cxx11::string::operator+=(local_68,'\\');
          }
        }
        std::__cxx11::string::operator+=(local_68,local_128);
        local_17c = 0;
      }
    }
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_108);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
    bVar1 = join::anon_class_1_0_00000001::operator()(&local_21,*pcVar6);
    if (((!bVar1) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
       (pcVar6 = (char *)std::__cxx11::string::back(), *pcVar6 != ':')) {
      std::operator+(local_1a0,(char)local_48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      goto LAB_00167e9c;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
LAB_00167e9c:
  local_17c = 1;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return this;
}

Assistant:

std::string join (std::string const & path,
                              std::initializer_list<std::string> const & paths) {
                auto is_path_sep = [] (char const c) { return c == '/' || c == '\\'; };

                std::string result_drive;
                std::string result_path;
                std::tie (result_drive, result_path) = split_drive (path);

                for (auto const & p : paths) {
                    std::string p_drive;
                    std::string p_path;
                    std::tie (p_drive, p_path) = split_drive (p);

                    if (!p_path.empty () && is_path_sep (p_path[0])) {
                        // The second path is absolute
                        if (!p_drive.empty () || result_drive.empty ()) {
                            result_drive = p_drive;
                        }

                        result_path = p_path;
                        continue;
                    }

                    if (!p_drive.empty () && p_drive != result_drive) {
                        PSTORE_ASSERT (p_drive.length () == 2 && p_drive[1] == ':');
                        PSTORE_ASSERT (result_drive.length () == 0 ||
                                       (result_drive.length () == 2 && result_drive[1] == ':'));

                        if (result_drive.length () == 0 ||
                            std::tolower (p_drive[0]) != std::tolower (result_drive[0])) {
                            // Different drives so ignore the first path entirely
                            result_drive = p_drive;
                            result_path = p_path;
                            continue;
                        }

                        // Same drive in different case
                        result_drive = p_drive;
                    }

                    // Second path is relative to the first
                    if (!result_path.empty () && !is_path_sep (result_path.back ())) {
                        result_path += '\\';
                    }
                    result_path += p_path;
                }

                // Add separator between UNC and non-absolute path
                if (!result_path.empty () && !is_path_sep (result_path[0]) &&
                    !result_drive.empty () && result_drive.back () != ':') {

                    return result_drive + '\\' + result_path;
                }

                return result_drive + result_path;
            }